

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

SRes LzmaEnc_CodeOneMemBlock
               (CLzmaEncHandle pp,Bool_conflict reInit,Byte *dest,size_t *destLen,
               UInt32 desiredPackSize,UInt32 *unpackSize)

{
  int iVar1;
  SRes SVar2;
  CSeqOutStreamBuf outStream;
  code *local_50;
  Byte *local_48;
  size_t local_40;
  int local_38;
  
  local_50 = MyWrite;
  local_40 = *destLen;
  local_38 = 0;
  *(undefined8 *)((long)pp + 0x84) = 0;
  *(undefined4 *)((long)pp + 0xb0) = 0;
  local_48 = dest;
  if (reInit != 0) {
    LzmaEnc_Init((CLzmaEnc *)pp);
  }
  LzmaEnc_InitPrices((CLzmaEnc *)pp);
  iVar1 = *(int *)((long)pp + 0x98);
  *(undefined8 *)((long)pp + 0xc0) = 0;
  *(undefined4 *)((long)pp + 0xb8) = 0xffffffff;
  *(undefined8 *)((long)pp + 200) = 1;
  *(undefined1 *)((long)pp + 0xbc) = 0;
  *(undefined8 *)((long)pp + 0xd0) = *(undefined8 *)((long)pp + 0xe0);
  *(undefined8 *)((long)pp + 0xf0) = 0;
  *(undefined4 *)((long)pp + 0xf8) = 0;
  *(code ***)((long)pp + 0xe8) = &local_50;
  SVar2 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,1,desiredPackSize,*unpackSize);
  *unpackSize = *(int *)((long)pp + 0x98) - iVar1;
  *destLen = *destLen - local_40;
  if (local_38 != 0) {
    SVar2 = 7;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_CodeOneMemBlock(CLzmaEncHandle pp, Bool reInit,
    Byte *dest, size_t *destLen, UInt32 desiredPackSize, UInt32 *unpackSize)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  UInt64 nowPos64;
  SRes res;
  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = False;
  p->finished = False;
  p->result = SZ_OK;

  if (reInit)
    LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  nowPos64 = p->nowPos64;
  RangeEnc_Init(&p->rc);
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_CodeOneBlock(p, True, desiredPackSize, *unpackSize);
  
  *unpackSize = (UInt32)(p->nowPos64 - nowPos64);
  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;

  return res;
}